

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNSelf::gen_code_member
          (CTPNSelf *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  short sVar1;
  int iVar2;
  undefined4 in_ECX;
  undefined4 in_register_0000000c;
  long *in_RDX;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  int in_R8D;
  uint in_R9D;
  vm_prop_id_t prop;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  undefined2 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  
  uVar3 = in_ECX;
  iVar2 = CTcCodeStream::is_self_available(G_cs);
  if (iVar2 == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  iVar2 = CTcGenTarg::is_speculative(G_cg);
  if ((iVar2 != 0) &&
     ((in_R8D != 0 ||
      ((CONCAT44(prop_is_expr,argc) != 0 && (*(int *)CONCAT44(prop_is_expr,argc) != 0)))))) {
    err_throw(0);
  }
  sVar1 = (**(code **)(*in_RDX + 200))(in_RDX,0,uVar3);
  if (sVar1 == 0) {
    iVar2 = CTcGenTarg::is_speculative(G_cg);
    if (iVar2 == 0) {
      if (in_R9D != 0) {
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      }
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf_00,
                 CONCAT44(in_register_0000000c,in_ECX));
      CTcGenTarg::note_pop(G_cg,in_R8D + 1);
    }
    else {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcGenTarg::note_push((CTcGenTarg *)0x27bdf5);
      CTcGenTarg::note_pop(G_cg,2);
    }
  }
  else {
    iVar2 = CTcGenTarg::is_speculative(G_cg);
    if (iVar2 == 0) {
      if (in_R8D == 0) {
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcDataStream::write_prop_id((CTcDataStream *)CONCAT44(uVar3,in_R8D),in_R9D);
      }
      else {
        if (in_R9D != 0) {
          CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        }
        CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
        CTcDataStream::write
                  (&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf,
                   CONCAT44(in_register_0000000c,in_ECX));
        CTcDataStream::write_prop_id((CTcDataStream *)CONCAT44(uVar3,in_R8D),in_R9D);
        CTcGenTarg::note_pop(G_cg,in_R8D);
      }
    }
    else {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcDataStream::write_prop_id((CTcDataStream *)CONCAT44(uVar3,in_R8D),in_R9D);
      CTcGenTarg::note_push((CTcGenTarg *)0x27bcf2);
      CTcGenTarg::note_pop((CTcGenTarg *)0x27bd01);
    }
  }
  CTcGenTarg::post_call_cleanup
            ((CTcGenTarg *)CONCAT44(uVar3,in_R8D),
             (CTcNamedArgs *)CONCAT44(in_R9D,CONCAT22(sVar1,in_stack_ffffffffffffffd8)));
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::note_push((CTcGenTarg *)0x27beba);
  }
  return;
}

Assistant:

void CTPNSelf::gen_code_member(int discard,
                               CTcPrsNode *prop_expr, int prop_is_expr,
                               int argc, int varargs,
                               CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;
    
    /* make sure "self" is available */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* don't allow arguments in speculative eval mode */
    if (G_cg->is_speculative()
        && (argc != 0 || (named_args != 0 && named_args->cnt != 0)))
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple GETPROPSELF or
     *   CALLPROPSELF; otherwise, generate a PTRCALLPROPSELF 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* 
         *   we have a constant property ID - generate a GETPROPDATA,
         *   GETPROPSELF, or CALLPROPSELF with the property ID as
         *   immediate data 
         */
        if (G_cg->is_speculative())
        {
            /* speculative - use GETPROPDATA */
            G_cg->write_op(OPC_PUSHSELF);
            G_cg->write_op(OPC_GETPROPDATA);
            G_cs->write_prop_id(prop);

            /* we pushed one element (self) and popped it back off */
            G_cg->note_push();
            G_cg->note_pop();
        }
        else if (argc == 0)
        {
            /* no arguments - generate a GETPROPSELF */
            G_cg->write_op(OPC_GETPROPSELF);
            G_cs->write_prop_id(prop);
        }
        else
        {
            /* add a varargs modifier if appropriate */
            if (varargs)
                G_cg->write_op(OPC_VARARGC);
            
            /* we have arguments - generate a CALLPROPSELF */
            G_cg->write_op(OPC_CALLPROPSELF);
            G_cs->write((char)argc);
            G_cs->write_prop_id(prop);

            /* this removes arguments */
            G_cg->note_pop(argc);
        }
    }
    else
    {
        /* 
         *   a property pointer is on the stack - use PTRGETPROPDATA or
         *   PTRCALLPROPSELF, depending on the speculative mode 
         */
        if (G_cg->is_speculative())
        {
            /* speculative - use PTRGETPROPDATA after pushing self */
            G_cg->write_op(OPC_PUSHSELF);
            G_cg->write_op(OPC_PTRGETPROPDATA);

            /* we pushed self then removed self and the property ID */
            G_cg->note_push();
            G_cg->note_pop(2);
        }
        else
        {
            /* 
             *   if we have a varargs list, modify the call instruction
             *   that follows to make it a varargs call 
             */
            if (varargs)
            {
                /* swap to get the arg counter back on top */
                G_cg->write_op(OPC_SWAP);
                
                /* write the varargs modifier */
                G_cg->write_op(OPC_VARARGC);
            }

            /* a prop pointer is on the stack - write a PTRCALLPROPSELF */
            G_cg->write_op(OPC_PTRCALLPROPSELF);
            G_cs->write((int)argc);
            
            /* this removes arguments and the property pointer */
            G_cg->note_pop(argc + 1);
        }
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}